

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h__02_Writer.cpp
# Opt level: O0

h__AS02WriterFrame * __thiscall
AS_02::h__AS02WriterFrame::WriteEKLVPacket
          (h__AS02WriterFrame *this,FrameBuffer *FrameBuf,byte_t *EssenceUL,
          ui32_t *MinEssenceElementBerLength,AESEncContext *Ctx,HMACContext *HMAC)

{
  int iVar1;
  ui32_t uVar2;
  byte_t *value;
  ui64_t offset;
  PartitionPair local_2c8;
  FileWriter local_2b0 [104];
  Partition body_part;
  UL local_180;
  Batch<ASDCP::UL> local_160 [64];
  undefined1 local_120 [8];
  UL body_ul;
  IndexEntry Entry;
  ui64_t this_stream_offset;
  AESEncContext *Ctx_local;
  ui32_t *MinEssenceElementBerLength_local;
  byte_t *EssenceUL_local;
  FrameBuffer *FrameBuf_local;
  h__AS02WriterFrame *this_local;
  Result_t *result;
  
  ASDCP::Write_EKLV_Packet
            ((FileWriter *)this,(Dictionary *)(FrameBuf + 0x10),*(OP1aHeader **)(FrameBuf + 8),
             (WriterInfo *)(FrameBuf + 0x50),FrameBuf + 0x378,(uint *)(FrameBuf + 0x348),
             (ulonglong *)(FrameBuf + 0x338),FrameBuf + 0x340,EssenceUL,MinEssenceElementBerLength,
             Ctx,HMAC);
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar1) {
    ASDCP::MXF::IndexTableSegment::IndexEntry::IndexEntry((IndexEntry *)&stack0xffffffffffffff68);
    MXF::AS02IndexWriterVBR::PushIndexEntry
              ((AS02IndexWriterVBR *)(FrameBuf + 0x448),(IndexEntry *)&stack0xffffffffffffff68);
    ASDCP::MXF::IndexTableSegment::IndexEntry::~IndexEntry((IndexEntry *)&stack0xffffffffffffff68);
  }
  if ((1 < *(uint *)(FrameBuf + 0x338)) &&
     ((*(int *)(FrameBuf + 0x338) + 1U) % *(uint *)(FrameBuf + 0x440) == 0)) {
    uVar2 = MXF::AS02IndexWriterVBR::GetDuration((AS02IndexWriterVBR *)(FrameBuf + 0x448));
    if (uVar2 == 0) {
      __assert_fail("m_IndexWriter.GetDuration() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/h__02_Writer.cpp"
                    ,0xd6,
                    "Result_t AS_02::h__AS02WriterFrame::WriteEKLVPacket(const ASDCP::FrameBuffer &, const byte_t *, const ui32_t &, AESEncContext *, HMACContext *)"
                   );
    }
    h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>::FlushIndexPartition
              ((h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR> *)
               (body_ul.super_Identifier<16U>.m_Value + 0xf));
    Kumu::Result_t::~Result_t((Result_t *)(body_ul.super_Identifier<16U>.m_Value + 0xf));
    value = ASDCP::Dictionary::ul(*(Dictionary **)(FrameBuf + 8),MDD_ClosedCompleteBodyPartition);
    ASDCP::UL::UL((UL *)local_120,value);
    ASDCP::MXF::Partition::Partition
              ((Partition *)&stack0xfffffffffffffdb8,*(Dictionary **)(FrameBuf + 8));
    ASDCP::UL::operator=(&local_180,(UL *)(FrameBuf + 0x118));
    ASDCP::MXF::Batch<ASDCP::UL>::operator=(local_160,(Batch<ASDCP::UL> *)(FrameBuf + 0x138));
    offset = Kumu::IFileReader::TellPosition((IFileReader *)(FrameBuf + 0x10));
    ASDCP::MXF::Partition::WriteToFile(local_2b0,(UL *)&stack0xfffffffffffffdb8);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_2b0);
    Kumu::Result_t::~Result_t((Result_t *)local_2b0);
    ASDCP::MXF::RIP::PartitionPair::PartitionPair(&local_2c8,1,offset);
    std::__cxx11::
    list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>::push_back
              ((list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                *)(FrameBuf + 0x2e8),&local_2c8);
    ASDCP::MXF::RIP::PartitionPair::~PartitionPair(&local_2c8);
    ASDCP::MXF::Partition::~Partition((Partition *)&stack0xfffffffffffffdb8);
    ASDCP::UL::~UL((UL *)local_120);
  }
  return this;
}

Assistant:

Result_t
AS_02::h__AS02WriterFrame::WriteEKLVPacket(const ASDCP::FrameBuffer& FrameBuf,const byte_t* EssenceUL,
					   const ui32_t& MinEssenceElementBerLength,
					   AESEncContext* Ctx, HMACContext* HMAC)
{
  ui64_t this_stream_offset = m_StreamOffset; // m_StreamOffset will be changed by the call to Write_EKLV_Packet

  Result_t result = Write_EKLV_Packet(m_File, *m_Dict, m_HeaderPart, m_Info, m_CtFrameBuf, m_FramesWritten,
				      m_StreamOffset, FrameBuf, EssenceUL, MinEssenceElementBerLength, Ctx, HMAC);

  if ( KM_SUCCESS(result) )
    {  
      IndexTableSegment::IndexEntry Entry;
      Entry.StreamOffset = this_stream_offset;
      m_IndexWriter.PushIndexEntry(Entry);
    }

  if ( m_FramesWritten > 1 && ( ( m_FramesWritten + 1 ) % m_PartitionSpace ) == 0 )
    {
      assert(m_IndexWriter.GetDuration() > 0);
      FlushIndexPartition();

      UL body_ul(m_Dict->ul(MDD_ClosedCompleteBodyPartition));
      Partition body_part(m_Dict);
      body_part.MajorVersion = m_HeaderPart.MajorVersion;
      body_part.MinorVersion = m_HeaderPart.MinorVersion;
      body_part.BodySID = 1;
      body_part.OperationalPattern = m_HeaderPart.OperationalPattern;
      body_part.EssenceContainers = m_HeaderPart.EssenceContainers;
      body_part.ThisPartition = m_File.TellPosition();

      body_part.BodyOffset = m_StreamOffset;
      result = body_part.WriteToFile(m_File, body_ul);
      m_RIP.PairArray.push_back(RIP::PartitionPair(1, body_part.ThisPartition));
    }

  return result;
}